

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O0

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::collect_changes
          (DynamicPartialIndex *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *sv,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uint uVar1;
  size_type sVar2;
  bool bVar3;
  reference pvVar4;
  const_reference this_00;
  reference puVar5;
  reference pvVar6;
  uint *nxt;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  value_type cur;
  uint *s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dist_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *reverse_graph_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *graph_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sv_local;
  DynamicPartialIndex *this_local;
  
  this->back_ = 0;
  this->front_ = 0;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(sv);
  s = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(sv);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)&s), bVar3) {
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar5);
    if ((*pvVar6 != '\0') && (bVar3 = has_parent(this,*puVar5,reverse_graph,dist), !bVar3)) {
      uVar1 = *puVar5;
      sVar2 = this->back_;
      this->back_ = sVar2 + 1;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar2);
      *pvVar4 = uVar1;
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar5);
      *pvVar6 = '?';
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this->updated_,puVar5);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  while (this->back_ != this->front_) {
    sVar2 = this->front_;
    this->front_ = sVar2 + 1;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar2);
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::at(graph,(ulong)*pvVar4);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    nxt = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&nxt), bVar3) {
      puVar5 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar5);
      if (((*pvVar6 != '?') &&
          (pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (dist,(ulong)*puVar5), *pvVar6 != '\0')) &&
         (bVar3 = has_parent(this,*puVar5,reverse_graph,dist), !bVar3)) {
        uVar1 = *puVar5;
        sVar2 = this->back_;
        this->back_ = sVar2 + 1;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar2);
        *pvVar4 = uVar1;
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar5)
        ;
        *pvVar6 = '?';
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this->updated_,puVar5);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::collect_changes(const std::vector<vertex_t> &sv,
                                                                 const std::vector<std::vector<vertex_t>> &graph,
                                                                 const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                                 std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    for (const auto &s : sv) {
        if (dist.at(s) > 0 && !has_parent(s, reverse_graph, dist)) {
            queue_.at(back_++) = s;
            dist.at(s) = INF8;
            updated_.push_back(s);
        }
    }
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8 && dist.at(nxt) > 0 && !has_parent(nxt, reverse_graph, dist)) {
                queue_.at(back_++) = nxt;
                dist.at(nxt) = INF8;
                updated_.push_back(nxt);
            }
        }
    }
}